

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matryoshka.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t sVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  bool bVar5;
  int iVar6;
  int iVar7;
  string *fname;
  typed_value<double,_char> *this;
  typed_value<double,_char> *ptVar8;
  typed_value<int,_char> *matProp_00;
  char *pcVar9;
  typed_value<bool,_char> *this_00;
  typed_value<bool,_char> *ptVar10;
  typed_value<bool,_char> *ptVar11;
  char *pcVar12;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar13;
  size_type sVar14;
  ostream *poVar15;
  element_type *peVar16;
  size_type sVar17;
  WeightedDomainEnsemble *dEnsemble_00;
  MatrixProperties *matProp_01;
  size_type sVar18;
  ulong uVar19;
  double **VI_S_00;
  double *pdVar20;
  reference pvVar21;
  void *pvVar22;
  reference pDVar23;
  size_type sVar24;
  reference pvVar25;
  undefined8 *puVar26;
  undefined8 uStackY_e60;
  int aiStackY_e58 [2];
  MatrixProperties *in_stack_fffffffffffff1b8;
  Params *in_stack_fffffffffffff1c0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff1c8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff1d0;
  undefined4 in_stack_fffffffffffff1d8;
  undefined4 in_stack_fffffffffffff1dc;
  MatrixProperties *in_stack_fffffffffffff1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1e8;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *in_stack_fffffffffffff1f0;
  size_t local_e08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff200;
  size_t sVar27;
  vector<Domain,_std::allocator<Domain>_> *in_stack_fffffffffffff208;
  undefined4 in_stack_fffffffffffff210;
  undefined4 in_stack_fffffffffffff214;
  size_t local_de8;
  undefined4 local_ddc;
  undefined4 local_dd8;
  int local_dd4;
  undefined1 *local_dd0;
  int local_dc4;
  void *local_dc0;
  ostream *local_db8;
  undefined8 local_db0;
  float local_da8;
  float local_da4;
  size_t local_da0;
  undefined4 local_d94;
  undefined4 local_d90;
  int local_d8c;
  undefined1 *local_d88;
  long local_d80;
  long local_d78;
  double *local_d70;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_fffffffffffff298;
  undefined8 *puVar28;
  undefined8 *puVar29;
  undefined8 in_stack_fffffffffffff2a0;
  options_description *in_stack_fffffffffffff2a8;
  char **in_stack_fffffffffffff2b0;
  undefined8 in_stack_fffffffffffff2b8;
  double **VI_S_01;
  WeightedDomainEnsemble *in_stack_fffffffffffff2f0;
  char *local_c18;
  typed_value<double,_char> *local_c10;
  typed_value<double,_char> *local_c08;
  int iStack_c04;
  undefined8 local_c00;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *local_bf8;
  undefined8 local_bf0;
  char *local_be8;
  typed_value<int,_char> *local_be0;
  typed_value<int,_char> *local_bd8;
  char *local_bd0;
  typed_value<bool,_char> *local_bc8;
  typed_value<bool,_char> *local_bc0;
  typed_value<bool,_char> *local_bb8;
  char *local_bb0;
  typed_value<unsigned_long,_char> *local_ba8;
  typed_value<unsigned_long,_char> *local_ba0;
  char *local_b98;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *local_b90;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *local_b88;
  char *local_b80;
  char *local_b78;
  typed_value<double,_char> *local_b70;
  typed_value<double,_char> *local_b68;
  char *local_b60;
  allocator *dSet;
  int aiStack_b38 [2];
  error *e;
  undefined8 auStack_b28 [10];
  string local_ad8 [56];
  string local_aa0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> consensusFile_1;
  size_type local_a58;
  size_t i_4;
  DomainSet dConsensusHier_1;
  WeightedDomainEnsemble dEnsemble_2;
  shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  mat_topass;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  passed_ptr;
  size_t end;
  size_t start;
  Domain d;
  iterator __end4;
  iterator __begin4;
  vector<Domain,_std::allocator<Domain>_> *__range4;
  string *in_stack_fffffffffffff748;
  int in_stack_fffffffffffff754;
  string *in_stack_fffffffffffff758;
  string local_8a0 [56];
  string local_868 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> consensusFile;
  string *in_stack_fffffffffffff7f8;
  WeightedDomainEnsemble dEnsemble_1;
  undefined1 local_788 [4];
  int hier;
  double local_760;
  double gamma;
  undefined1 local_750 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  allMu;
  vector<Domain,_std::allocator<Domain>_> dConsensusHierTemp;
  vector<Domain,_std::allocator<Domain>_> dConsensusHier;
  vector<Domain,_std::allocator<Domain>_> dConsensusParent;
  int pIndex;
  int curIndex;
  int i_3;
  int sizeFill;
  int indexTemp;
  int index;
  double gammaTemp;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int local_6b4;
  int i_2;
  int maxHier;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> uniqEnd;
  vector<int,_std::allocator<int>_> temp;
  undefined1 local_660 [4];
  int resultSize;
  vector<int,_std::allocator<int>_> PAMresult;
  int i_1;
  double **VI_S;
  string local_5e0 [56];
  string local_5a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> multiscaleFile;
  int i;
  int K;
  int areaCovered;
  undefined1 local_4c8 [8];
  WeightedDomainEnsemble dEnsemble;
  shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  mat;
  string local_410 [32];
  string local_3f0 [120];
  undefined1 local_378 [8];
  MatrixProperties matProp;
  double eps;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [32];
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  basic_parsed_options local_288 [40];
  variables_map local_260 [8];
  variables_map vm;
  allocator local_1b9;
  string local_1b8 [35];
  undefined1 local_195;
  undefined4 local_194;
  undefined8 local_190;
  undefined4 local_188;
  undefined1 local_181;
  undefined8 local_180;
  undefined8 local_178;
  string *local_170 [3];
  allocator local_151;
  string local_150 [32];
  options_description local_130 [8];
  options_description opts;
  string local_b0 [8];
  Params p;
  char *str;
  char **argv_local;
  int argc_local;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffff2b8 >> 0x20);
  iVar6 = (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20);
  p.chrom.field_2._8_8_ = anon_var_dwarf_f695;
  main::Params::Params(in_stack_fffffffffffff1c0);
  dSet = &local_151;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"matryoshka options",dSet);
  boost::program_options::options_description::options_description
            (local_130,local_150,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  fname = (string *)boost::program_options::options_description::add_options();
  local_170[0] = fname;
  this = boost::program_options::value<double>((double *)in_stack_fffffffffffff1d0._M_current);
  ptVar8 = boost::program_options::typed_value<double,_char>::required(this);
  local_b60 = (char *)boost::program_options::options_description_easy_init::operator()
                                ((char *)local_170,(value_semantic *)"gammaMax,g",(char *)ptVar8);
  local_b68 = boost::program_options::value<double>((double *)in_stack_fffffffffffff1d0._M_current);
  local_178 = 0;
  local_b70 = boost::program_options::typed_value<double,_char>::default_value
                        ((typed_value<double,_char> *)in_stack_fffffffffffff1f0,
                         (double *)in_stack_fffffffffffff1e8);
  local_b78 = (char *)boost::program_options::options_description_easy_init::operator()
                                (local_b60,(value_semantic *)"gammaMin,x",(char *)local_b70);
  local_b80 = (char *)boost::program_options::options_description_easy_init::operator()
                                (local_b78,"help,h");
  local_b88 = boost::program_options::value<std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff1d0._M_current);
  local_b90 = boost::program_options::
              typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
              ::required(local_b88);
  local_b98 = (char *)boost::program_options::options_description_easy_init::operator()
                                (local_b80,(value_semantic *)"input,i",(char *)local_b90);
  local_ba0 = boost::program_options::value<unsigned_long>
                        ((unsigned_long *)in_stack_fffffffffffff1d0._M_current);
  local_180 = 1;
  local_ba8 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                        ((typed_value<unsigned_long,_char> *)in_stack_fffffffffffff1f0,
                         (unsigned_long *)in_stack_fffffffffffff1e8);
  local_bb0 = (char *)boost::program_options::options_description_easy_init::operator()
                                (local_b98,(value_semantic *)"topK,k",(char *)local_ba8);
  local_bb8 = boost::program_options::value<bool>((bool *)in_stack_fffffffffffff1d0._M_current);
  local_bc0 = boost::program_options::typed_value<bool,_char>::zero_tokens(local_bb8);
  local_181 = 0;
  local_bc8 = boost::program_options::typed_value<bool,_char>::default_value
                        ((typed_value<bool,_char> *)in_stack_fffffffffffff1f0,
                         (bool *)in_stack_fffffffffffff1e8);
  local_bd0 = (char *)boost::program_options::options_description_easy_init::operator()
                                (local_bb0,(value_semantic *)"outputMultiscale,m",(char *)local_bc8)
  ;
  local_bd8 = boost::program_options::value<int>(in_stack_fffffffffffff1d0._M_current);
  local_188 = 100;
  local_be0 = boost::program_options::typed_value<int,_char>::default_value
                        ((typed_value<int,_char> *)in_stack_fffffffffffff1f0,
                         (int *)in_stack_fffffffffffff1e8);
  local_be8 = (char *)boost::program_options::options_description_easy_init::operator()
                                (local_bd0,(value_semantic *)"minMeanSamples,n",(char *)local_be0);
  local_bf0 = boost::program_options::value<std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff1d0._M_current);
  local_bf8 = boost::program_options::
              typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
              ::required(local_bf0);
  local_c00 = (char *)boost::program_options::options_description_easy_init::operator()
                                (local_be8,(value_semantic *)"output,o",(char *)local_bf8);
  local_c08 = boost::program_options::value<double>((double *)in_stack_fffffffffffff1d0._M_current);
  local_190 = 0x3fa999999999999a;
  local_c10 = boost::program_options::typed_value<double,_char>::default_value
                        ((typed_value<double,_char> *)in_stack_fffffffffffff1f0,
                         (double *)in_stack_fffffffffffff1e8);
  local_c18 = (char *)boost::program_options::options_description_easy_init::operator()
                                (local_c00,(value_semantic *)"stepSize,s",(char *)local_c10);
  boost::program_options::value<int>(in_stack_fffffffffffff1d0._M_current);
  local_194 = 40000;
  matProp_00 = boost::program_options::typed_value<int,_char>::default_value
                         ((typed_value<int,_char> *)in_stack_fffffffffffff1f0,
                          (int *)in_stack_fffffffffffff1e8);
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_c18,(value_semantic *)"resolution,r",(char *)matProp_00);
  this_00 = boost::program_options::value<bool>((bool *)in_stack_fffffffffffff1d0._M_current);
  ptVar10 = boost::program_options::typed_value<bool,_char>::zero_tokens(this_00);
  local_195 = 0;
  ptVar11 = boost::program_options::typed_value<bool,_char>::default_value
                      ((typed_value<bool,_char> *)in_stack_fffffffffffff1f0,
                       (bool *)in_stack_fffffffffffff1e8);
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar9,(value_semantic *)"parseSparseFormat,R",(char *)ptVar11);
  boost::program_options::value<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1d0._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"N/A",&local_1b9);
  ptVar13 = boost::program_options::
            typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
            ::default_value(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
  boost::program_options::options_description_easy_init::operator()
            (pcVar12,(value_semantic *)"chromosome,c",(char *)ptVar13);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  boost::program_options::variables_map::variables_map(local_260);
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)0x1c056a);
  boost::program_options::parse_command_line<char>
            (iVar7,in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,iVar6,
             in_stack_fffffffffffff298);
  boost::program_options::store(local_288,local_260,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x1c05bb);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)0x1c05c7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"help",&local_2c9);
  sVar14 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)in_stack_fffffffffffff1d0._M_current,
                   (key_type *)in_stack_fffffffffffff1c8._M_current);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  if (sVar14 != 0) {
    poVar15 = std::operator<<((ostream *)&std::cerr,(char *)p.chrom.field_2._8_8_);
    std::operator<<(poVar15,"\n");
    poVar15 = (ostream *)boost::program_options::operator<<((ostream *)&std::cerr,local_130);
    std::operator<<(poVar15,"\n");
    exit(1);
  }
  boost::program_options::notify(local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"input",(allocator *)((long)&eps + 7));
  sVar14 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)in_stack_fffffffffffff1d0._M_current,
                   (key_type *)in_stack_fffffffffffff1c8._M_current);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&eps + 7));
  if (sVar14 == 0) {
    std::operator<<((ostream *)&std::cerr,"Input file was not set.\n");
    exit(1);
  }
  poVar15 = std::operator<<((ostream *)&std::cerr,"Reading input from ");
  poVar15 = std::operator<<(poVar15,local_b0);
  std::operator<<(poVar15,".\n");
  std::operator+((char *)in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  std::__cxx11::string::operator=((string *)&p.resolution,(string *)&matProp.muBI);
  std::__cxx11::string::~string((string *)&matProp.muBI);
  MatrixProperties::MatrixProperties((MatrixProperties *)in_stack_fffffffffffff1c0);
  if (((byte)p.minMeanSamples & 1) == 0) {
    std::__cxx11::string::string
              ((string *)
               &mat.
                super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,local_b0);
    parseGZipMatrix(in_stack_fffffffffffff7f8);
    MatrixProperties::operator=
              ((MatrixProperties *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8);
    MatrixProperties::~MatrixProperties((MatrixProperties *)in_stack_fffffffffffff1c0);
    std::__cxx11::string::~string
              ((string *)
               &mat.
                super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  else {
    std::__cxx11::string::string(local_3f0,local_b0);
    std::__cxx11::string::string(local_410,(string *)&p.resolution);
    parseSparseMatrix(in_stack_fffffffffffff758,in_stack_fffffffffffff754,in_stack_fffffffffffff748)
    ;
    MatrixProperties::operator=
              ((MatrixProperties *)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8);
    MatrixProperties::~MatrixProperties((MatrixProperties *)in_stack_fffffffffffff1c0);
    std::__cxx11::string::~string(local_410);
    std::__cxx11::string::~string(local_3f0);
  }
  std::
  shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  ::shared_ptr((shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffff1c0,&in_stack_fffffffffffff1b8->matrix);
  poVar15 = std::operator<<((ostream *)&std::cerr,"MatrixParser read matrix of size: ");
  peVar16 = std::
            __shared_ptr_access<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1c0b0c);
  sVar17 = boost::numeric::ublas::
           matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           ::size1(peVar16);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,sVar17);
  dEnsemble_00 = (WeightedDomainEnsemble *)std::operator<<(poVar15," x ");
  peVar16 = std::
            __shared_ptr_access<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1c0b61);
  matProp_01 = (MatrixProperties *)
               boost::numeric::ublas::
               matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::size2(peVar16);
  poVar15 = (ostream *)std::ostream::operator<<(dEnsemble_00,(ulong)matProp_01);
  std::operator<<(poVar15,"\n");
  MatrixProperties::MatrixProperties
            (in_stack_fffffffffffff1e0,
             (MatrixProperties *)CONCAT44(in_stack_fffffffffffff1dc,in_stack_fffffffffffff1d8));
  multiscaleDomains((MatrixProperties *)matProp_00,(float)((ulong)pcVar9 >> 0x20),SUB84(pcVar9,0),
                    (double)this_00,(int)((ulong)ptVar10 >> 0x20),(int)ptVar10);
  MatrixProperties::~MatrixProperties((MatrixProperties *)in_stack_fffffffffffff1c0);
  MatrixProperties::MatrixProperties
            (in_stack_fffffffffffff1e0,
             (MatrixProperties *)CONCAT44(in_stack_fffffffffffff1dc,in_stack_fffffffffffff1d8));
  iVar6 = calCoverage(dEnsemble_00,matProp_01);
  MatrixProperties::~MatrixProperties((MatrixProperties *)in_stack_fffffffffffff1c0);
  sVar18 = std::
           vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
           ::size((vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                   *)local_4c8);
  multiscaleFile.field_2._12_4_ = (undefined4)sVar18;
  if ((p.stepSize._0_1_ & 1) != 0) {
    in_stack_fffffffffffff2f0 =
         (WeightedDomainEnsemble *)
         std::operator<<((ostream *)&std::cerr,"Writing all multi scale domains to file");
    std::ostream::operator<<(in_stack_fffffffffffff2f0,std::endl<char,std::char_traits<char>>);
    for (multiscaleFile.field_2._8_4_ = 0;
        (int)multiscaleFile.field_2._8_4_ < (int)multiscaleFile.field_2._12_4_;
        multiscaleFile.field_2._8_4_ = multiscaleFile.field_2._8_4_ + 1) {
      std::operator+(in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0);
      std::
      vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
      ::operator[]((vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                    *)local_4c8,(long)(int)multiscaleFile.field_2._8_4_);
      std::vector<Domain,_std::allocator<Domain>_>::vector
                ((vector<Domain,_std::allocator<Domain>_> *)
                 CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210),
                 in_stack_fffffffffffff208);
      std::__cxx11::string::string(local_5e0,local_5a8);
      MatrixProperties::MatrixProperties
                (in_stack_fffffffffffff1e0,
                 (MatrixProperties *)CONCAT44(in_stack_fffffffffffff1dc,in_stack_fffffffffffff1d8));
      outputDomains((DomainSet *)dSet,fname,(MatrixProperties *)this,(int)((ulong)ptVar8 >> 0x20),
                    SUB84(ptVar8,0));
      MatrixProperties::~MatrixProperties((MatrixProperties *)in_stack_fffffffffffff1c0);
      std::__cxx11::string::~string(local_5e0);
      std::vector<Domain,_std::allocator<Domain>_>::~vector
                ((vector<Domain,_std::allocator<Domain>_> *)in_stack_fffffffffffff1d0._M_current);
      std::__cxx11::string::~string(local_5a8);
    }
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(int)multiscaleFile.field_2._12_4_;
  uVar19 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar19 = 0xffffffffffffffff;
  }
  VI_S_00 = (double **)operator_new__(uVar19);
  VI_S_01 = VI_S_00;
  for (PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < (int)multiscaleFile.field_2._12_4_;
      PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)(int)multiscaleFile.field_2._12_4_;
    uVar19 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar19 = 0xffffffffffffffff;
    }
    pdVar20 = (double *)operator_new__(uVar19);
    VI_S_00[PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_] = pdVar20;
  }
  getVImatrix(in_stack_fffffffffffff2f0,VI_S_01);
  getCluster((vector<int,_std::allocator<int>_> *)local_660,VI_S_00,multiscaleFile.field_2._12_4_);
  sVar18 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)local_660);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210),
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff1b8);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff1b8);
  __first._M_current._4_4_ = in_stack_fffffffffffff1dc;
  __first._M_current._0_4_ = in_stack_fffffffffffff1d8;
  std::unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (__first,in_stack_fffffffffffff1d0);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff1b8);
  uVar19 = std::distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                     (in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
  iVar7 = (int)uVar19;
  poVar15 = std::operator<<((ostream *)&std::cerr,"There are ");
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar7);
  poVar15 = std::operator<<(poVar15," levels of hierarchy with clustering: ");
  std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
  for (local_6b4 = 0; local_6b4 < (int)sVar18; local_6b4 = local_6b4 + 1) {
    pvVar21 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_660,(long)local_6b4);
    poVar15 = (ostream *)std::ostream::operator<<(&std::cerr,*pvVar21);
    std::operator<<(poVar15," ");
  }
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  local_d70 = (double *)
              (&stack0xfffffffffffff1b8 + -((uVar19 & 0xffffffff) * 8 + 0xf & 0xfffffffffffffff0));
  puVar26 = (undefined8 *)((long)local_d70 - ((uVar19 & 0xffffffff) * 8 + 0xf & 0xfffffffffffffff0))
  ;
  _indexTemp = p.gammaMax;
  puVar28 = puVar26;
  puVar26[-1] = 0x1c11c1;
  pvVar21 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)local_660,0);
  i_3 = *pvVar21;
  curIndex = 0;
  puVar29 = puVar28;
  *local_d70 = p.gammaMax;
  puVar28[iVar7 + -1] = p.outputPrefix.field_2._8_8_;
  for (pIndex = 0; pIndex < (int)sVar18; pIndex = pIndex + 1) {
    puVar26[-1] = 0x1c1232;
    pvVar21 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_660,(long)pIndex);
    iVar1 = *pvVar21;
    if (i_3 != iVar1) {
      local_d70[curIndex + 1] = _indexTemp;
      puVar29[curIndex] = _indexTemp - (double)p.k;
      curIndex = curIndex + 1;
      i_3 = iVar1;
    }
    _indexTemp = (double)p.k + _indexTemp;
  }
  puVar26[-1] = 0x1c12ec;
  std::vector<Domain,_std::allocator<Domain>_>::vector
            ((vector<Domain,_std::allocator<Domain>_> *)puVar26[-1]);
  puVar26[-1] = 0x1c12f8;
  std::vector<Domain,_std::allocator<Domain>_>::vector
            ((vector<Domain,_std::allocator<Domain>_> *)puVar26[-1]);
  puVar26[-1] = 0x1c1304;
  std::vector<Domain,_std::allocator<Domain>_>::vector
            ((vector<Domain,_std::allocator<Domain>_> *)puVar26[-1]);
  local_d80 = (long)(int)multiscaleFile.field_2._12_4_;
  local_d78 = (long)&gamma + 7;
  puVar26[-1] = 0x1c1325;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)puVar26[-1]);
  puVar26[-1] = 0x1c133f;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)puVar26[5],puVar26[4],(allocator_type *)puVar26[3]);
  puVar26[-1] = 0x1c134d;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)puVar26[-1]);
  sizeFill = 0;
  for (local_760 = p.gammaMax; local_760 <= (double)p.outputPrefix.field_2._8_8_ + 1e-05;
      local_760 = (double)p.k + local_760) {
    local_d88 = local_788;
    puVar26[-1] = 0x1c139d;
    std::
    shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
    ::shared_ptr((shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                  *)puVar26[1],
                 (shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                  *)*puVar26);
    puVar26[-1] = 0x1c13bf;
    getMu((shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
           *)puVar26[0x14],*(float *)((long)puVar26 + 0x9c),*(int *)(puVar26 + 0x13));
    puVar26[-1] = 0x1c13d4;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)local_750,(long)sizeFill);
    puVar26[-1] = 0x1c13e3;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)puVar26[3],
               (vector<double,_std::allocator<double>_> *)puVar26[2]);
    puVar26[-1] = 0x1c13ef;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)puVar26[3]);
    puVar26[-1] = 0x1c13fb;
    std::
    shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
    ::~shared_ptr((shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                   *)puVar26[-1]);
    sizeFill = sizeFill + 1;
  }
  sizeFill = 0;
  for (dEnsemble_1.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      dEnsemble_1.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ <= iVar7;
      dEnsemble_1.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           dEnsemble_1.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    if (dEnsemble_1.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == 1) {
      p.outputPrefix.field_2._8_8_ = *puVar29;
      p.gammaMax = *local_d70;
      puVar26[-1] = 0x1c14e8;
      MatrixProperties::MatrixProperties
                ((MatrixProperties *)puVar26[5],(MatrixProperties *)puVar26[4]);
      local_da8 = (float)(double)p.outputPrefix.field_2._8_8_;
      local_da4 = (float)p.gammaMax;
      local_da0 = p.k;
      local_d94 = p.gammaMin._0_4_;
      local_d90 = p.stepSize._4_4_;
      local_d8c = iVar6;
      puVar26[-1] = 0x1c154a;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)puVar26[0xb],
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)puVar26[10]);
      *(int *)(puVar26 + -2) = sizeFill;
      puVar26[-3] = 0x1c15a0;
      multiscaleDomains((MatrixProperties *)puVar26[0x4c],*(float *)((long)puVar26 + 0x25c),
                        *(float *)(puVar26 + 0x4b),(double)puVar26[0x4a],
                        *(int *)((long)puVar26 + 0x24c),*(int *)(puVar26 + 0x49),
                        *(int *)((long)puVar26 + 0x244),
                        (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)puVar26[0x47],*(int *)(puVar26 + 0x4f));
      puVar26[-1] = 0x1c15b2;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)puVar26[3]);
      puVar26[-1] = 0x1c15be;
      MatrixProperties::~MatrixProperties((MatrixProperties *)puVar26[1]);
      puVar26[-1] = 0x1c15d1;
      consensusDomains((WeightedDomainEnsemble *)puVar26[0x46]);
      local_db0 = (undefined1 *)((long)&consensusFile.field_2 + 8);
      puVar26[-1] = 0x1c15ed;
      std::vector<Domain,_std::allocator<Domain>_>::operator=
                ((vector<Domain,_std::allocator<Domain>_> *)puVar26[3],
                 (vector<Domain,_std::allocator<Domain>_> *)puVar26[2]);
      puVar26[-1] = 0x1c15f9;
      std::vector<Domain,_std::allocator<Domain>_>::~vector
                ((vector<Domain,_std::allocator<Domain>_> *)puVar26[3]);
      puVar26[-1] = 0x1c1613;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar26[6]
                     ,(char *)puVar26[5]);
      puVar26[-1] = 0x1c1628;
      poVar15 = std::operator<<((ostream *)&std::cerr,"Writing consensus for level ");
      local_db8 = poVar15;
      puVar26[-1] = 0x1c1643;
      pvVar22 = (void *)std::ostream::operator<<(poVar15,1);
      local_dc0 = pvVar22;
      puVar26[-1] = 0x1c165f;
      std::ostream::operator<<(pvVar22,std::endl<char,std::char_traits<char>>);
      puVar26[-1] = 0x1c1674;
      std::vector<Domain,_std::allocator<Domain>_>::vector
                ((vector<Domain,_std::allocator<Domain>_> *)puVar26[0xb],
                 (vector<Domain,_std::allocator<Domain>_> *)puVar26[10]);
      puVar26[-1] = 0x1c1689;
      std::__cxx11::string::string(local_8a0,local_868);
      puVar26[-1] = 0x1c169e;
      MatrixProperties::MatrixProperties
                ((MatrixProperties *)puVar26[5],(MatrixProperties *)puVar26[4]);
      puVar26[-1] = 0x1c16cd;
      local_dc4 = outputDomains((DomainSet *)puVar26[0x65],(string *)puVar26[100],
                                (MatrixProperties *)puVar26[99],*(int *)((long)puVar26 + 0x314),
                                *(int *)(puVar26 + 0x62),*(int *)((long)puVar26 + 0x30c));
      puVar26[-1] = 0x1c16ed;
      MatrixProperties::~MatrixProperties((MatrixProperties *)puVar26[1]);
      puVar26[-1] = 0x1c16f9;
      std::__cxx11::string::~string(local_8a0);
      puVar26[-1] = 0x1c1705;
      std::vector<Domain,_std::allocator<Domain>_>::~vector
                ((vector<Domain,_std::allocator<Domain>_> *)puVar26[3]);
      sizeFill = (int)(((double)p.outputPrefix.field_2._8_8_ - p.gammaMax) / (double)p.k + 0.5) + 1;
      puVar26[-1] = 0x1c1739;
      std::__cxx11::string::~string(local_868);
      puVar26[-1] = 0x1c1745;
      WeightedDomainEnsemble::~WeightedDomainEnsemble((WeightedDomainEnsemble *)puVar26[1]);
    }
    else {
      p.outputPrefix.field_2._8_8_ =
           puVar29[dEnsemble_1.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + -1];
      p.gammaMax = local_d70[dEnsemble_1.weights.super__Vector_base<double,_std::allocator<double>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1];
      puVar26[-1] = 0x1c188d;
      sVar18 = std::vector<Domain,_std::allocator<Domain>_>::size
                         ((vector<Domain,_std::allocator<Domain>_> *)
                          &allMu.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar18 != 0) {
        puVar26[-1] = 0x1c18a6;
        std::vector<Domain,_std::allocator<Domain>_>::operator=
                  ((vector<Domain,_std::allocator<Domain>_> *)puVar26[0x15],
                   (vector<Domain,_std::allocator<Domain>_> *)puVar26[0x14]);
        puVar26[-1] = 0x1c18b4;
        std::vector<Domain,_std::allocator<Domain>_>::clear
                  ((vector<Domain,_std::allocator<Domain>_> *)puVar26[-1]);
      }
      puVar26[-1] = 0x1c18ce;
      __end4 = std::vector<Domain,_std::allocator<Domain>_>::begin
                         ((vector<Domain,_std::allocator<Domain>_> *)*puVar26);
      puVar26[-1] = 0x1c18e1;
      std::vector<Domain,_std::allocator<Domain>_>::end
                ((vector<Domain,_std::allocator<Domain>_> *)*puVar26);
      while( true ) {
        puVar26[-1] = 0x1c18fb;
        bVar5 = __gnu_cxx::operator!=
                          ((__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>
                            *)puVar26[1],
                           (__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>
                            *)*puVar26);
        if (!bVar5) break;
        puVar26[-1] = 0x1c1910;
        pDVar23 = __gnu_cxx::
                  __normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>::
                  operator*(&__end4);
        sVar4 = pDVar23->start;
        puVar26[-1] = 0x1c195b;
        std::
        __shared_ptr_access<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator*((__shared_ptr_access<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)puVar26[1]);
        puVar26[-1] = 0x1c197e;
        boost::numeric::ublas::
        subrange<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                  ((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    *)puVar26[10],puVar26[9],puVar26[8],puVar26[7],puVar26[6]);
        puVar26[-1] = 0x1c1993;
        boost::numeric::ublas::
        matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
        ::
        matrix<boost::numeric::ublas::matrix_range<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>>
                  ((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    *)puVar26[0xd],
                   (matrix_expression<boost::numeric::ublas::matrix_range<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                    *)puVar26[0xc]);
        puVar26[-1] = 0x1c19a1;
        boost::numeric::ublas::
        matrix_range<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
        ::~matrix_range((matrix_range<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                         *)puVar26[1]);
        puVar26[-1] = 0x1c19b4;
        std::
        make_shared<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>&>
                  ((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    *)puVar26[6]);
        local_dd0 = local_378;
        puVar26[-1] = 0x1c19d0;
        std::
        shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
        ::operator=((shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                     *)puVar26[1],
                    (shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                     *)*puVar26);
        puVar26[-1] = 0x1c19e3;
        MatrixProperties::MatrixProperties
                  ((MatrixProperties *)puVar26[5],(MatrixProperties *)puVar26[4]);
        local_de8 = p.k;
        local_ddc = p.gammaMin._0_4_;
        local_dd8 = p.stepSize._4_4_;
        local_dd4 = iVar6;
        puVar26[-1] = 0x1c1a45;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)puVar26[0xb],
                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)puVar26[10]);
        *(int *)(puVar26 + -2) = sizeFill;
        puVar26[-3] = 0x1c1a9b;
        multiscaleDomains((MatrixProperties *)puVar26[0x4c],*(float *)((long)puVar26 + 0x25c),
                          *(float *)(puVar26 + 0x4b),(double)puVar26[0x4a],
                          *(int *)((long)puVar26 + 0x24c),*(int *)(puVar26 + 0x49),
                          *(int *)((long)puVar26 + 0x244),
                          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)puVar26[0x47],*(int *)(puVar26 + 0x4f));
        puVar26[-1] = 0x1c1aad;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)puVar26[3]);
        puVar26[-1] = 0x1c1ab9;
        MatrixProperties::~MatrixProperties((MatrixProperties *)puVar26[1]);
        puVar26[-1] = 0x1c1acc;
        consensusDomains((WeightedDomainEnsemble *)puVar26[0x46]);
        local_a58 = 0;
        while( true ) {
          sVar18 = local_a58;
          puVar26[-1] = 0x1c1af3;
          sVar24 = std::vector<Domain,_std::allocator<Domain>_>::size
                             ((vector<Domain,_std::allocator<Domain>_> *)&i_4);
          if (sVar24 <= sVar18) break;
          local_e08 = sVar4;
          puVar26[-1] = 0x1c1b27;
          pvVar25 = std::vector<Domain,_std::allocator<Domain>_>::operator[]
                              ((vector<Domain,_std::allocator<Domain>_> *)&i_4,local_a58);
          pvVar25->start = local_e08 + pvVar25->start;
          sVar27 = sVar4;
          puVar26[-1] = 0x1c1b55;
          pvVar25 = std::vector<Domain,_std::allocator<Domain>_>::operator[]
                              ((vector<Domain,_std::allocator<Domain>_> *)&i_4,local_a58);
          pvVar25->end = sVar27 + pvVar25->end;
          local_a58 = local_a58 + 1;
        }
        puVar26[-1] = 0x1c1c39;
        std::vector<Domain,_std::allocator<Domain>_>::end
                  ((vector<Domain,_std::allocator<Domain>_> *)*puVar26);
        puVar26[-1] = 0x1c1c53;
        __gnu_cxx::__normal_iterator<Domain_const*,std::vector<Domain,std::allocator<Domain>>>::
        __normal_iterator<Domain*>
                  ((__normal_iterator<const_Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>
                    *)puVar26[1],
                   (__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_> *)
                   *puVar26);
        puVar26[-1] = 0x1c1c66;
        std::vector<Domain,_std::allocator<Domain>_>::begin
                  ((vector<Domain,_std::allocator<Domain>_> *)*puVar26);
        puVar26[-1] = 0x1c1c79;
        std::vector<Domain,_std::allocator<Domain>_>::end
                  ((vector<Domain,_std::allocator<Domain>_> *)*puVar26);
        puVar26[-1] = 0x1c1ca1;
        consensusFile_1.field_2._8_8_ =
             std::vector<Domain,std::allocator<Domain>>::
             insert<__gnu_cxx::__normal_iterator<Domain*,std::vector<Domain,std::allocator<Domain>>>,void>
                       ((vector<Domain,_std::allocator<Domain>_> *)puVar26[9],(Domain *)puVar26[0xc]
                        ,(Domain *)puVar26[0xb],(Domain *)puVar26[10]);
        puVar26[-1] = 0x1c1cd2;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       puVar26[6],(char *)puVar26[5]);
        puVar26[-1] = 0x1c1ce7;
        std::vector<Domain,_std::allocator<Domain>_>::vector
                  ((vector<Domain,_std::allocator<Domain>_> *)puVar26[0xb],
                   (vector<Domain,_std::allocator<Domain>_> *)puVar26[10]);
        puVar26[-1] = 0x1c1cfc;
        std::__cxx11::string::string(local_ad8,local_aa0);
        puVar26[-1] = 0x1c1d11;
        MatrixProperties::MatrixProperties
                  ((MatrixProperties *)puVar26[5],(MatrixProperties *)puVar26[4]);
        puVar26[-1] = 0x1c1d41;
        outputDomains((DomainSet *)puVar26[0x65],(string *)puVar26[100],
                      (MatrixProperties *)puVar26[99],*(int *)((long)puVar26 + 0x314),
                      *(int *)(puVar26 + 0x62),*(int *)((long)puVar26 + 0x30c));
        puVar26[-1] = 0x1c1d61;
        MatrixProperties::~MatrixProperties((MatrixProperties *)puVar26[1]);
        puVar26[-1] = 0x1c1d6d;
        std::__cxx11::string::~string(local_ad8);
        puVar26[-1] = 0x1c1d79;
        std::vector<Domain,_std::allocator<Domain>_>::~vector
                  ((vector<Domain,_std::allocator<Domain>_> *)puVar26[3]);
        puVar26[-1] = 0x1c1d85;
        std::__cxx11::string::~string(local_aa0);
        puVar26[-1] = 0x1c1d91;
        std::vector<Domain,_std::allocator<Domain>_>::~vector
                  ((vector<Domain,_std::allocator<Domain>_> *)puVar26[3]);
        puVar26[-1] = 0x1c1d9d;
        WeightedDomainEnsemble::~WeightedDomainEnsemble((WeightedDomainEnsemble *)puVar26[1]);
        puVar26[-1] = 0x1c1da9;
        std::
        shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
        ::~shared_ptr((shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                       *)puVar26[-1]);
        puVar26[-1] = 0x1c1db5;
        boost::numeric::ublas::
        matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::~matrix((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)puVar26[1]);
        puVar26[-1] = 0x1c1dc1;
        __gnu_cxx::__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>::
        operator++(&__end4);
      }
      puVar26[-1] = 0x1c1ea0;
      poVar15 = std::operator<<((ostream *)&std::cerr,"Writing consensus for level ");
      in_stack_fffffffffffff1d0._M_current = (int *)poVar15;
      puVar26[-1] = 0x1c1ebb;
      pvVar22 = (void *)std::ostream::operator<<
                                  (poVar15,dEnsemble_1.weights.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      puVar26[-1] = 0x1c1ed7;
      std::ostream::operator<<(pvVar22,std::endl<char,std::char_traits<char>>);
      sizeFill = (int)(((double)p.outputPrefix.field_2._8_8_ - p.gammaMax) / (double)p.k + 0.5) + 1
                 + sizeFill;
    }
  }
  puVar26[-1] = 0x1c1f29;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)puVar26[3]);
  puVar26[-1] = 0x1c1f35;
  std::vector<Domain,_std::allocator<Domain>_>::~vector
            ((vector<Domain,_std::allocator<Domain>_> *)puVar26[3]);
  puVar26[-1] = 0x1c1f41;
  std::vector<Domain,_std::allocator<Domain>_>::~vector
            ((vector<Domain,_std::allocator<Domain>_> *)puVar26[3]);
  puVar26[-1] = 0x1c1f4d;
  std::vector<Domain,_std::allocator<Domain>_>::~vector
            ((vector<Domain,_std::allocator<Domain>_> *)puVar26[3]);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff1d0._M_current);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff1d0._M_current);
  WeightedDomainEnsemble::~WeightedDomainEnsemble
            ((WeightedDomainEnsemble *)in_stack_fffffffffffff1c0);
  std::
  shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  ::~shared_ptr((shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                 *)0x1c1f87);
  MatrixProperties::~MatrixProperties((MatrixProperties *)in_stack_fffffffffffff1c0);
  boost::program_options::variables_map::~variables_map((variables_map *)in_stack_fffffffffffff1c0);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_fffffffffffff1c0);
  main::Params::~Params(in_stack_fffffffffffff1c0);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  auto str = R"(
	***********************************
	****                           ****
	****        MATRYOSHKA 1.0     ****
	****                           ****
	***********************************
	)";

  namespace po = boost::program_options;
  using std::string;
  using std::cerr;


  class Params {
    public:
    string inputFile;
    string outputPrefix;
    double gammaMax;
    double gammaMin;
    size_t k;
    double stepSize;
    bool outputMultiscale;
    int minMeanSamples;
    int resolution;
    bool sparseFormat; //rao input data format
    string chrom;
  };

  Params p;

  // Declare the supported options.
  po::options_description opts("matryoshka options");
  opts.add_options()
  ("gammaMax,g", po::value<double>(&p.gammaMax)->required(), "gamma-max (highest resolution to generate domains)")
  ("gammaMin,x", po::value<double>(&p.gammaMin)->default_value(0), "gamma-min (lowest resolution to generate domains)")
  ("help,h", "Produce help message")
  ("input,i", po::value<string>(&p.inputFile)->required(), "Input matrix file, expected format (tab-separated): <chromo>\\t<start>\\t<end>\\t<f1 f2 ...>")
  ("topK,k", po::value<size_t>(&p.k)->default_value(1), "Compute the top k optimal solutions")  
  ("outputMultiscale,m", po::value<bool>(&p.outputMultiscale)->zero_tokens()->default_value(false), "Output multiscale domains that are used for clustering to files as well")
  ("minMeanSamples,n", po::value<int>(&p.minMeanSamples)->default_value(100), "Minimum required number of samples to compute a mean")
  ("output,o", po::value<string>(&p.outputPrefix)->required(), "Output filename prefix")  
  ("stepSize,s", po::value<double>(&p.stepSize)->default_value(0.05), "Step size to increment resolution parameter")
  ("resolution,r", po::value<int>(&p.resolution)->default_value(40000), "Resolution of data")
  ("parseSparseFormat,R", po::value<bool>(&p.sparseFormat)->zero_tokens()->default_value(false), "Parse the sparse matrix format")
  ("chromosome,c", po::value<string>(&p.chrom)->default_value("N/A"), "Chromosome");

  po::variables_map vm;
  try {
    po::store(po::parse_command_line(argc, argv, opts), vm);

    if (vm.count("help")) {
      cerr << str << "\n";
      cerr << opts << "\n";
      std::exit(1);
    }

    po::notify(vm);    

    if (vm.count("input")) {
      double eps = 1e-5;
      cerr << "Reading input from " << p.inputFile << ".\n";

      p.chrom = "chr" + p.chrom;
      MatrixProperties matProp;
      if (p.sparseFormat) {
        matProp = parseSparseMatrix(p.inputFile, p.resolution, p.chrom);
      } else { 
          matProp = parseGZipMatrix(p.inputFile);
      }
      auto mat = matProp.matrix;
      cerr << "MatrixParser read matrix of size: " << mat->size1() << " x " << mat->size2()  << "\n";

      auto dEnsemble = multiscaleDomains(matProp, p.gammaMax, p.gammaMin, p.stepSize, p.k, p.minMeanSamples);

      int areaCovered = calCoverage(dEnsemble, matProp);
      int K = dEnsemble.domainSets.size();

      if (p.outputMultiscale) {
        cerr << "Writing all multi scale domains to file" << endl;
        for (int i=0; i<K; i++){
            auto multiscaleFile = p.outputPrefix + ".multiscale.txt";
            outputDomains(dEnsemble.domainSets[i], multiscaleFile, matProp, 0, p.gammaMin+(i*p.stepSize));
        }
      }
      
      double **VI_S = new double *[K];
      for(int i = 0; i < K; i++)
        VI_S[i] = new double[K];
      getVImatrix(dEnsemble, VI_S);

      //for (int i=0;i<K;i++){
      //  for (int j=0; j<K-1; j++)
      //    cerr << VI_S[i][j] << ",";
      //  cerr << VI_S[i][K-1] << endl;
      //}

      std::vector<int> PAMresult = getCluster(VI_S, K);
      int resultSize = PAMresult.size();
      std::vector<int> temp = PAMresult;
      auto uniqEnd = std::unique(temp.begin(), temp.end());
      int maxHier = std::distance(temp.begin(), uniqEnd);
      
      cerr << "There are " << maxHier << " levels of hierarchy with clustering: " << endl;
      for (int i = 0; i<resultSize; i++){
        cerr << PAMresult[i] << " ";
      }
      cerr << endl;

      double gammaMins[maxHier], gammaMaxes[maxHier], gammaTemp=p.gammaMin;
      int index, indexTemp=PAMresult[0], sizeFill=0;
      gammaMins[0] = p.gammaMin; //start of array min gamma
      gammaMaxes[maxHier-1] = p.gammaMax; //end of array max gamma
      for (int i=0; i<resultSize; i++) {
        index = int(PAMresult[i]);
        if (indexTemp != index) {
          gammaMins[sizeFill+1] = gammaTemp;
          gammaMaxes[sizeFill] = gammaTemp - p.stepSize;
          indexTemp = index;
          sizeFill++;
        }
        gammaTemp += p.stepSize;
      }
      
      int curIndex=1, pIndex=0;
      std::vector<Domain> dConsensusParent, dConsensusHier, dConsensusHierTemp;
      std::vector<std::vector<double>> allMu(K);

      index = 0;
      for (double gamma=p.gammaMin; gamma <= p.gammaMax+eps; gamma+=p.stepSize) {
        allMu[index] = getMu(mat, gamma, p.minMeanSamples);
        index++;
      }

      index = 0;
      for (int hier=1; hier<=maxHier; hier++) {
        if (hier==1) {
          p.gammaMax = gammaMaxes[hier-1];
          p.gammaMin = gammaMins[hier-1];

          auto dEnsemble = multiscaleDomains(matProp, p.gammaMax, p.gammaMin, p.stepSize, p.k, p.minMeanSamples, areaCovered, allMu, index);
          dConsensusParent = consensusDomains(dEnsemble);
          
          auto consensusFile = p.outputPrefix + ".consensus.txt";
          cerr << "Writing consensus for level " << hier << endl;
          curIndex = outputDomains(dConsensusParent, consensusFile, matProp, hier, curIndex, -1);
          index = int(((p.gammaMax - p.gammaMin) / p.stepSize)+0.5) + 1;
        } 
        else { 
          p.gammaMax = gammaMaxes[hier-1];
          p.gammaMin = gammaMins[hier-1];
          if(dConsensusHierTemp.size() > 0) {
            dConsensusParent = dConsensusHierTemp;
            dConsensusHierTemp.clear();
          }

          for (auto d : dConsensusParent) {
            size_t start = d.start;
            size_t end = d.end;
            pIndex++;
            
            //boost::numeric::ublas::compressed_matrix<double> passed_ptr = subrange(*mat, start, end, start, end);
            //using SparseMatrix = boost::numeric::ublas::compressed_matrix<double>;
            //std::shared_ptr<SparseMatrix> mat_topass = make_shared<SparseMatrix>(passed_ptr);
            boost::numeric::ublas::matrix<double> passed_ptr = subrange(*mat, start, end, start, end);
            using SparseMatrix = boost::numeric::ublas::matrix<double>;
            std::shared_ptr<SparseMatrix> mat_topass = make_shared<SparseMatrix>(passed_ptr);
            matProp.matrix = mat_topass;
            auto dEnsemble = multiscaleDomains(matProp, p.gammaMax, p.gammaMin, p.stepSize, p.k, p.minMeanSamples, areaCovered, allMu, index);

            auto dConsensusHier = consensusDomains(dEnsemble);
            for (size_t i=0; i<dConsensusHier.size(); i++){
              dConsensusHier[i].start += start;
              dConsensusHier[i].end += start;
            }
            dConsensusHierTemp.insert(dConsensusHierTemp.end(), dConsensusHier.begin(), dConsensusHier.end());
            auto consensusFile = p.outputPrefix + ".consensus.txt";
            curIndex = outputDomains(dConsensusHier, consensusFile, matProp, hier, curIndex, pIndex);
          }
          cerr << "Writing consensus for level " << hier << endl;
          index += int(((p.gammaMax - p.gammaMin) / p.stepSize)+0.5) + 1;
        }
      }

    } else {
      cerr << "Input file was not set.\n";
      std::exit(1);
    }

  } catch (po::error& e) {
    cerr << "exception : [" << e.what() << "]. Exiting.\n";
    std::exit(1);
  }

  return 0;
}